

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O3

ares_bool_t ares_timedout(ares_timeval_t *now,ares_timeval_t *check)

{
  if (check->sec < now->sec) {
    return ARES_TRUE;
  }
  if (-1 < now->sec - check->sec) {
    return (ares_bool_t)(check->usec <= now->usec);
  }
  return ARES_FALSE;
}

Assistant:

ares_bool_t ares_timedout(const ares_timeval_t *now,
                          const ares_timeval_t *check)
{
  ares_int64_t secs = (now->sec - check->sec);

  if (secs > 0) {
    return ARES_TRUE; /* yes, timed out */
  }
  if (secs < 0) {
    return ARES_FALSE; /* nope, not timed out */
  }

  /* if the full seconds were identical, check the sub second parts */
  return ((ares_int64_t)now->usec - (ares_int64_t)check->usec) >= 0
           ? ARES_TRUE
           : ARES_FALSE;
}